

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O0

size_t ZSTD_decompressMultiFrame
                 (ZSTD_DCtx *dctx,void *dst,size_t dstCapacity,void *src,size_t srcSize,void *dict,
                 size_t dictSize,ZSTD_DDict *ddict)

{
  bool bVar1;
  U32 UVar2;
  uint uVar3;
  ZSTD_ErrorCode ZVar4;
  ZSTD_DCtx *pZVar5;
  ZSTD_DCtx *pZVar6;
  void *in_RDX;
  void *in_RSI;
  ZSTD_DCtx *in_RDI;
  ZSTD_DCtx *in_R8;
  long in_R9;
  size_t res;
  size_t err_code_2;
  size_t err_code_1;
  size_t err_code;
  size_t skippableSize;
  U32 magicNumber;
  int moreThan1Frame;
  void *dststart;
  void *in_stack_ffffffffffffff90;
  ZSTD_DCtx *in_stack_ffffffffffffff98;
  ZSTD_DCtx *in_stack_ffffffffffffffa0;
  ZSTD_DCtx *in_stack_ffffffffffffffa8;
  ZSTD_DCtx *local_30;
  void *local_20;
  void *local_18;
  size_t local_8;
  
  bVar1 = false;
  if ((in_R9 != 0) && (err_code_2 != 0)) {
    __assert_fail("dict==NULL || ddict==NULL",
                  "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                  ,0x9f73,
                  "size_t ZSTD_decompressMultiFrame(ZSTD_DCtx *, void *, size_t, const void *, size_t, const void *, size_t, const ZSTD_DDict *)"
                 );
  }
  local_30 = in_R8;
  local_20 = in_RDX;
  local_18 = in_RSI;
  if (err_code_2 != 0) {
    ZSTD_DDict_dictContent((ZSTD_DDict *)0x2f4540);
    res = ZSTD_DDict_dictSize((ZSTD_DDict *)0x2f4552);
  }
  while( true ) {
    while( true ) {
      pZVar6 = local_30;
      pZVar5 = (ZSTD_DCtx *)
               ZSTD_startingInputLength((ZSTD_format_e)((ulong)in_stack_ffffffffffffff90 >> 0x20));
      if (pZVar6 < pZVar5) {
        if (local_30 == (ZSTD_DCtx *)0x0) {
          local_8 = (long)local_18 - (long)in_RSI;
        }
        else {
          local_8 = 0xffffffffffffffb8;
        }
        return local_8;
      }
      if ((local_30 < (ZSTD_DCtx *)0x4) ||
         (UVar2 = MEM_readLE32(pZVar6), (UVar2 & 0xfffffff0) != 0x184d2a50)) break;
      pZVar6 = (ZSTD_DCtx *)
               readSkippableFrameSize(in_stack_ffffffffffffffa8,(size_t)in_stack_ffffffffffffffa0);
      in_stack_ffffffffffffffa8 = pZVar6;
      uVar3 = ERR_isError((size_t)pZVar6);
      if (uVar3 != 0) {
        return (size_t)in_stack_ffffffffffffffa8;
      }
      if (local_30 < pZVar6) {
        __assert_fail("skippableSize <= srcSize",
                      "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                      ,0x9f99,
                      "size_t ZSTD_decompressMultiFrame(ZSTD_DCtx *, void *, size_t, const void *, size_t, const void *, size_t, const ZSTD_DDict *)"
                     );
      }
      local_30 = (ZSTD_DCtx *)((long)local_30 - (long)pZVar6);
    }
    if (err_code_2 == 0) {
      in_stack_ffffffffffffff98 =
           (ZSTD_DCtx *)
           ZSTD_decompressBegin_usingDict
                     (in_stack_ffffffffffffff98,in_stack_ffffffffffffff90,(size_t)pZVar6);
      uVar3 = ERR_isError((size_t)in_stack_ffffffffffffff98);
      pZVar6 = in_stack_ffffffffffffff98;
    }
    else {
      pZVar6 = (ZSTD_DCtx *)
               ZSTD_decompressBegin_usingDDict
                         (in_stack_ffffffffffffffa8,(ZSTD_DDict *)in_stack_ffffffffffffffa0);
      uVar3 = ERR_isError((size_t)pZVar6);
      in_stack_ffffffffffffffa0 = pZVar6;
    }
    if (uVar3 != 0) {
      return (size_t)pZVar6;
    }
    ZSTD_checkContinuity(in_RDI,local_18,(size_t)local_20);
    in_stack_ffffffffffffff90 =
         (void *)ZSTD_decompressFrame
                           ((ZSTD_DCtx *)skippableSize,(void *)err_code,err_code_1,
                            (void **)err_code_2,(size_t *)res);
    ZVar4 = ZSTD_getErrorCode(0x2f470b);
    if ((ZVar4 == ZSTD_error_prefix_unknown) && (bVar1)) {
      return 0xffffffffffffffb8;
    }
    uVar3 = ZSTD_isError(0x2f472f);
    if (uVar3 != 0) {
      return (size_t)in_stack_ffffffffffffff90;
    }
    if (local_20 < in_stack_ffffffffffffff90) break;
    if (in_stack_ffffffffffffff90 != (void *)0x0) {
      local_18 = (void *)((long)local_18 + (long)in_stack_ffffffffffffff90);
    }
    local_20 = (void *)((long)local_20 - (long)in_stack_ffffffffffffff90);
    bVar1 = true;
  }
  __assert_fail("res <= dstCapacity",
                "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                ,0x9fb8,
                "size_t ZSTD_decompressMultiFrame(ZSTD_DCtx *, void *, size_t, const void *, size_t, const void *, size_t, const ZSTD_DDict *)"
               );
}

Assistant:

static size_t ZSTD_decompressMultiFrame(ZSTD_DCtx* dctx,
                                        void* dst, size_t dstCapacity,
                                  const void* src, size_t srcSize,
                                  const void* dict, size_t dictSize,
                                  const ZSTD_DDict* ddict)
{
    void* const dststart = dst;
    int moreThan1Frame = 0;

    DEBUGLOG(5, "ZSTD_decompressMultiFrame");
    assert(dict==NULL || ddict==NULL);  /* either dict or ddict set, not both */

    if (ddict) {
        dict = ZSTD_DDict_dictContent(ddict);
        dictSize = ZSTD_DDict_dictSize(ddict);
    }

    while (srcSize >= ZSTD_startingInputLength(dctx->format)) {

#if defined(ZSTD_LEGACY_SUPPORT) && (ZSTD_LEGACY_SUPPORT >= 1)
        if (ZSTD_isLegacy(src, srcSize)) {
            size_t decodedSize;
            size_t const frameSize = ZSTD_findFrameCompressedSizeLegacy(src, srcSize);
            if (ZSTD_isError(frameSize)) return frameSize;
            RETURN_ERROR_IF(dctx->staticSize, memory_allocation,
                "legacy support is not compatible with static dctx");

            decodedSize = ZSTD_decompressLegacy(dst, dstCapacity, src, frameSize, dict, dictSize);
            if (ZSTD_isError(decodedSize)) return decodedSize;

            assert(decodedSize <= dstCapacity);
            dst = (BYTE*)dst + decodedSize;
            dstCapacity -= decodedSize;

            src = (const BYTE*)src + frameSize;
            srcSize -= frameSize;

            continue;
        }
#endif

        if (srcSize >= 4) {
            U32 const magicNumber = MEM_readLE32(src);
            DEBUGLOG(5, "reading magic number %08X", (unsigned)magicNumber);
            if ((magicNumber & ZSTD_MAGIC_SKIPPABLE_MASK) == ZSTD_MAGIC_SKIPPABLE_START) {
                /* skippable frame detected : skip it */
                size_t const skippableSize = readSkippableFrameSize(src, srcSize);
                FORWARD_IF_ERROR(skippableSize, "invalid skippable frame");
                assert(skippableSize <= srcSize);

                src = (const BYTE *)src + skippableSize;
                srcSize -= skippableSize;
                continue; /* check next frame */
        }   }

        if (ddict) {
            /* we were called from ZSTD_decompress_usingDDict */
            FORWARD_IF_ERROR(ZSTD_decompressBegin_usingDDict(dctx, ddict), "");
        } else {
            /* this will initialize correctly with no dict if dict == NULL, so
             * use this in all cases but ddict */
            FORWARD_IF_ERROR(ZSTD_decompressBegin_usingDict(dctx, dict, dictSize), "");
        }
        ZSTD_checkContinuity(dctx, dst, dstCapacity);

        {   const size_t res = ZSTD_decompressFrame(dctx, dst, dstCapacity,
                                                    &src, &srcSize);
            RETURN_ERROR_IF(
                (ZSTD_getErrorCode(res) == ZSTD_error_prefix_unknown)
             && (moreThan1Frame==1),
                srcSize_wrong,
                "At least one frame successfully completed, "
                "but following bytes are garbage: "
                "it's more likely to be a srcSize error, "
                "specifying more input bytes than size of frame(s). "
                "Note: one could be unlucky, it might be a corruption error instead, "
                "happening right at the place where we expect zstd magic bytes. "
                "But this is _much_ less likely than a srcSize field error.");
            if (ZSTD_isError(res)) return res;
            assert(res <= dstCapacity);
            if (res != 0)
                dst = (BYTE*)dst + res;
            dstCapacity -= res;
        }
        moreThan1Frame = 1;
    }  /* while (srcSize >= ZSTD_frameHeaderSize_prefix) */

    RETURN_ERROR_IF(srcSize, srcSize_wrong, "input not entirely consumed");

    return (size_t)((BYTE*)dst - (BYTE*)dststart);
}